

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parsePrimaryExpression(Parser *this)

{
  TokenType TVar1;
  undefined8 extraout_RAX;
  long in_RSI;
  Parser *this_00;
  allocator local_31;
  
  TVar1 = Token::type((Token *)(in_RSI + 0x20));
  if (TVar1 == LEFT_PARENTHESIS) {
    parseParenthesisExpression(this);
  }
  else if (TVar1 == IDENTIFIER) {
    parseIdentifierExpression(this);
  }
  else {
    if (TVar1 != NUMBER) {
      this_00 = (Parser *)&stack0xffffffffffffffd0;
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffd0,"Expected an expression",&local_31);
      parseError(this_00,(string *)&stack0xffffffffffffffd0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
      _Unwind_Resume(extraout_RAX);
    }
    parseNumberExpression(this);
  }
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parsePrimaryExpression() {
	switch (mCurrentToken.type()) {
	case TokenType::NUMBER:
		return parseNumberExpression();
	case TokenType::IDENTIFIER:
		return parseIdentifierExpression();
	case TokenType::LEFT_PARENTHESIS:
		return parseParenthesisExpression();
	default:
		parseError("Expected an expression");
		return nullptr;
	}
}